

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightParameters.hpp
# Opt level: O2

void __thiscall OpenMD::Perturbations::LightParameters::~LightParameters(LightParameters *this)

{
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__LightParameters_00206300;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->Polarization);
  ParameterBase::~ParameterBase(&(this->Intensity).super_ParameterBase);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter(&this->WaveVector);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter(&this->PropagationDirection);
  ParameterBase::~ParameterBase(&(this->Frequency).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->Wavelength).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseLight).super_ParameterBase);
  DataHolder::~DataHolder(&this->super_DataHolder);
  return;
}

Assistant:

virtual ~LightParameters() = default;